

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

bool ImGui::IsRectVisible(ImVec2 *size)

{
  float *pfVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  
  pIVar2 = GImGui->CurrentWindow;
  fVar3 = (pIVar2->DC).CursorPos.y;
  if (((fVar3 < (pIVar2->ClipRect).Max.y) &&
      (fVar3 = fVar3 + size->y, pfVar1 = &(pIVar2->ClipRect).Min.y,
      *pfVar1 <= fVar3 && fVar3 != *pfVar1)) &&
     (fVar3 = (pIVar2->DC).CursorPos.x, fVar3 < (pIVar2->ClipRect).Max.x)) {
    fVar3 = fVar3 + size->x;
    return (pIVar2->ClipRect).Min.x <= fVar3 && fVar3 != (pIVar2->ClipRect).Min.x;
  }
  return false;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }